

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O1

IntVect amrex::indexFromValue<amrex::FArrayBox,void>
                  (FabArray<amrex::FArrayBox> *mf,int comp,IntVect *nghost,
                  value_type_conflict2 value)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar6;
  int iVar5;
  uint uVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  IntVect IVar15;
  MFIter mfi;
  Box local_ec;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,&mf->super_FabArrayBase,true);
  uVar13 = 0x80000000;
  uVar14 = 0x80000000;
  iVar5 = -0x80000000;
  if (local_90.currentIndex < local_90.endIndex) {
    iVar5 = -0x80000000;
    uVar11 = 0x80000000;
    uVar12 = 0x80000000;
    do {
      MFIter::growntilebox(&local_ec,&local_90,nghost);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_d0,mf,&local_90);
      lVar4 = (long)local_ec.smallend.vect[2];
      if (local_ec.bigend.vect[2] < local_ec.smallend.vect[2]) {
        uVar13 = (ulong)uVar12;
      }
      else {
        pdVar9 = (double *)
                 (local_d0.nstride * (long)comp * 8 +
                  (lVar4 - local_d0.begin.z) * local_d0.kstride * 8 +
                  ((long)local_ec.smallend.vect[1] - (long)local_d0.begin.y) * local_d0.jstride * 8
                  + (long)local_ec.smallend.vect[0] * 8 + (long)local_d0.begin.x * -8 +
                 (long)local_d0.p);
        do {
          uVar14 = (long)local_ec.smallend.vect[1];
          pdVar10 = pdVar9;
          if (local_ec.bigend.vect[1] < local_ec.smallend.vect[1]) {
            uVar13 = (ulong)uVar12;
          }
          else {
            do {
              pdVar8 = pdVar10;
              iVar6 = iVar5;
              uVar7 = local_ec.smallend.vect[0];
              if (local_ec.bigend.vect[0] < local_ec.smallend.vect[0]) {
                uVar13 = (ulong)uVar12;
              }
              else {
                do {
                  bVar1 = NAN(value);
                  bVar2 = NAN(*pdVar8);
                  bVar3 = value != *pdVar8;
                  uVar13 = uVar14 & 0xffffffff;
                  if (bVar3) {
                    uVar13 = (ulong)uVar12;
                  }
                  if (bVar1 || bVar2) {
                    uVar13 = (ulong)uVar12;
                  }
                  uVar12 = uVar7;
                  if (bVar3) {
                    uVar12 = uVar11;
                  }
                  if (bVar1 || bVar2) {
                    uVar12 = uVar11;
                  }
                  uVar11 = uVar12;
                  iVar5 = (int)lVar4;
                  if (bVar3) {
                    iVar5 = iVar6;
                  }
                  if (bVar1 || bVar2) {
                    iVar5 = iVar6;
                  }
                  uVar7 = uVar7 + 1;
                  uVar12 = (uint)uVar13;
                  pdVar8 = pdVar8 + 1;
                  iVar6 = iVar5;
                } while (local_ec.bigend.vect[0] + 1U != uVar7);
              }
              uVar14 = uVar14 + 1;
              pdVar10 = pdVar10 + local_d0.jstride;
              uVar12 = (uint)uVar13;
            } while (local_ec.bigend.vect[1] + 1 != (int)uVar14);
          }
          lVar4 = lVar4 + 1;
          pdVar9 = pdVar9 + local_d0.kstride;
          uVar12 = (uint)uVar13;
        } while (local_ec.bigend.vect[2] + 1 != (int)lVar4);
      }
      uVar14 = (ulong)uVar11;
      MFIter::operator++(&local_90);
      uVar12 = (uint)uVar13;
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  uVar14 = uVar13 << 0x20 | uVar14;
  IVar15.vect[2] = iVar5;
  IVar15.vect[0] = (int)uVar14;
  IVar15.vect[1] = (int)(uVar14 >> 0x20);
  return (IntVect)IVar15.vect;
}

Assistant:

IntVect
indexFromValue (FabArray<FAB> const& mf, int comp, IntVect const& nghost,
                typename FAB::value_type value)
{
    IntVect loc;

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion())
    {
        amrex::Gpu::Buffer<int> aa({0,AMREX_D_DECL(0,0,0)});
        int* p = aa.data();
        // This is a device ptr to 1+AMREX_SPACEDIM int zeros.
        // The first is used as an atomic bool and the others for intvect.
        if (mf.isFusingCandidate()) {
            auto const& ma = mf.const_arrays();
            ParallelFor(mf, nghost, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                int* flag = p;
                if (*flag == 0) {
                    if (ma[box_no](i,j,k,comp) == value) {
                        if (Gpu::Atomic::Exch(flag,1) == 0) {
                            AMREX_D_TERM(p[1] = i;,
                                         p[2] = j;,
                                         p[3] = k;);
                        }
                    }
                }
            });
        } else {
            for (MFIter mfi(mf,MFItInfo().SetDeviceSync(false)); mfi.isValid(); ++mfi) {
                const Box& bx = amrex::grow(mfi.validbox(), nghost);
                auto const& arr = mf.const_array(mfi);
                amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    int* flag = p;
                    if (*flag == 0) {
                        if (arr(i,j,k,comp) == value) {
                            if (Gpu::Atomic::Exch(flag,1) == 0) {
                                AMREX_D_TERM(p[1] = i;,
                                             p[2] = j;,
                                             p[3] = k;);
                            }
                        }
                    }
                });
            }
        }
        int const* tmp = aa.copyToHost();
        AMREX_D_TERM(loc[0] = tmp[1];,
                     loc[1] = tmp[2];,
                     loc[2] = tmp[3];);
    }
    else
#endif
    {
        bool f = false;
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        {
            IntVect priv_loc = IntVect::TheMinVector();
            for (MFIter mfi(mf,true); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox(nghost);
                auto const& fab = mf.const_array(mfi);
                AMREX_LOOP_3D(bx, i, j, k,
                {
                    if (fab(i,j,k,comp) == value) priv_loc = IntVect(AMREX_D_DECL(i,j,k));
                });
            }

            if (priv_loc.allGT(IntVect::TheMinVector())) {
                bool old;
// we should be able to test on _OPENMP < 201107 for capture (version 3.1)
// but we must work around a bug in gcc < 4.9
// And, with NVHPC 21.9, we see an ICE with the atomic capture (NV bug: #3390723)
#if defined(AMREX_USE_OMP) && defined(_OPENMP) && (_OPENMP < 201307 || defined(__NVCOMPILER)) // OpenMP 4.0
#pragma omp critical (amrex_indexfromvalue)
#elif defined(AMREX_USE_OMP)
#pragma omp atomic capture
#endif
                {
                    old = f;
                    f = true;
                }

                if (old == false) loc = priv_loc;
            }
        }
    }

    return loc;
}